

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.h
# Opt level: O0

void __thiscall jsonnet::internal::TraceFrame::~TraceFrame(TraceFrame *this)

{
  long in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x40));
  LocationRange::~LocationRange((LocationRange *)0x24fa36);
  return;
}

Assistant:

TraceFrame(const LocationRange &location, const std::string &name = "")
        : location(location), name(name)
    {
    }